

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_settings.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::proxy_settings::proxy_settings(proxy_settings *this,settings_pack *sett)

{
  settings_pack *sett_local;
  proxy_settings *this_local;
  
  ::std::__cxx11::string::string((string *)this);
  ::std::__cxx11::string::string((string *)&this->username);
  ::std::__cxx11::string::string((string *)&this->password);
  this->type = none;
  this->port = 0;
  this->proxy_hostnames = true;
  this->proxy_peer_connections = true;
  this->proxy_tracker_connections = true;
  anon_unknown_3::init<libtorrent::settings_pack>(this,sett);
  return;
}

Assistant:

proxy_settings::proxy_settings(settings_pack const& sett)
{ init(*this, sett); }